

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILPSolver.cpp
# Opt level: O1

void __thiscall CILPSolver::PrepareCoeffBuffer(CILPSolver *this,int iNumCoeff,int iNumVariable)

{
  double *pdVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (iNumCoeff != 0) {
    if (this->m_iNumCoeff < iNumCoeff) {
      if (this->m_pCoeff != (double *)0x0) {
        operator_delete__(this->m_pCoeff);
        this->m_pCoeff = (double *)0x0;
      }
      if (this->m_pCoeffIndex != (int *)0x0) {
        operator_delete__(this->m_pCoeffIndex);
        this->m_pCoeffIndex = (int *)0x0;
      }
      this->m_iNumCoeff = iNumCoeff;
      uVar5 = (long)iNumCoeff * 8 + 8;
      if (iNumCoeff < -1) {
        uVar5 = 0xffffffffffffffff;
      }
      uVar6 = (long)iNumCoeff * 4 + 4;
      if (iNumCoeff < -1) {
        uVar6 = 0xffffffffffffffff;
      }
      pdVar1 = (double *)operator_new__(uVar5);
      this->m_pCoeff = pdVar1;
      piVar2 = (int *)operator_new__(uVar6);
      this->m_pCoeffIndex = piVar2;
    }
    if (iNumVariable != 0) {
      if (-1 < iNumCoeff) {
        pdVar1 = this->m_pCoeff;
        uVar5 = 0;
        do {
          pdVar1[uVar5] = 1.0;
          uVar5 = uVar5 + 1;
        } while (iNumCoeff + 1 != uVar5);
      }
      iVar3 = (iNumVariable - iNumCoeff) + 2;
      if (iVar3 <= iNumVariable) {
        piVar2 = this->m_pCoeffIndex;
        lVar4 = 0;
        do {
          piVar2[lVar4 + 1] = iVar3 + (int)lVar4;
          lVar4 = lVar4 + 1;
        } while ((ulong)(uint)iNumCoeff - 1 != lVar4);
      }
    }
    return;
  }
  __assert_fail("iNumCoeff",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/ILPSolver.cpp"
                ,0x1ed,"void CILPSolver::PrepareCoeffBuffer(int, int)");
}

Assistant:

void CILPSolver::PrepareCoeffBuffer(int iNumCoeff, int iNumVariable)
{
	assert(iNumCoeff);

	if(iNumCoeff>m_iNumCoeff)
	{
		SAFE_DELA(m_pCoeff);
		SAFE_DELA(m_pCoeffIndex);

		m_iNumCoeff		=	iNumCoeff;
		m_pCoeff		=	new	double[m_iNumCoeff+1];
		m_pCoeffIndex	=	new	int[m_iNumCoeff+1];

		assert(m_pCoeff);
		assert(m_pCoeffIndex);
	}

	if(iNumVariable)
	{
		for(int i=0;i<iNumCoeff+1;++i)	m_pCoeff[i]	=	1;
		for(int iIndex=1,i=iNumVariable-iNumCoeff+2;i<=iNumVariable;++i)	m_pCoeffIndex[iIndex++]	=	i;		
	}

#ifdef _DEBUG
	m_pCoeffIndex[0]			=	-99;
	m_pCoeffIndex[m_iNumCoeff]	=	-99;
	m_pCoeff[0]					=	-99;
	m_pCoeff[m_iNumCoeff]		=	-99;
#endif
}